

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

void tcu::getCubeLinearSamples
               (ConstPixelBufferAccess (*faceAccesses) [6],CubeFace baseFace,float u,float v,
               int depth,Vec4 (*dst) [4])

{
  undefined8 *puVar1;
  undefined8 uVar2;
  int i_1;
  CubeFace CVar3;
  ulong uVar4;
  undefined4 in_register_00000014;
  int iVar5;
  ulong uVar6;
  Vec4 *pVVar7;
  int i;
  long lVar8;
  Vector<float,_4> *a;
  float fVar9;
  float in_XMM0_Db;
  float in_XMM1_Db;
  CubeFaceIntCoords CVar10;
  bool hasBothCoordsOutOfBounds [4];
  ConstPixelBufferAccess local_d8;
  int local_b0;
  int local_ac;
  ConstPixelBufferAccess (*local_a0) [6];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  Vec4 sampleColors [4];
  
  iVar5 = (*faceAccesses)[0].m_size.m_data[0];
  local_98 = u + -0.5;
  fStack_94 = v + -0.5;
  fStack_90 = in_XMM0_Db + 0.0;
  fStack_8c = in_XMM1_Db + 0.0;
  local_a0 = faceAccesses;
  local_88 = floorf(local_98);
  fVar9 = floorf(fStack_94);
  local_d8.m_size.m_data[2] = (int)local_88;
  local_d8.m_pitch.m_data[0] = (int)fVar9;
  local_d8.m_pitch.m_data[1] = local_d8.m_size.m_data[2] + 1;
  local_d8.m_data._4_4_ = local_d8.m_pitch.m_data[0] + 1;
  lVar8 = 0;
  local_d8.m_pitch.m_data[2] = local_d8.m_pitch.m_data[0];
  local_d8.m_data._0_4_ = local_d8.m_size.m_data[2];
  local_b0 = local_d8.m_pitch.m_data[1];
  local_ac = local_d8.m_data._4_4_;
  do {
    Vector<float,_4>::Vector((Vector<float,_4> *)((long)sampleColors[0].m_data + lVar8));
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x40);
  pVVar7 = sampleColors;
  for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
    local_d8.m_format.order = baseFace;
    uVar2 = *(undefined8 *)(local_d8.m_pitch.m_data + lVar8 * 2 + -1);
    local_d8.m_format.type = (ChannelType)uVar2;
    local_d8.m_size.m_data[0] = (int)((ulong)uVar2 >> 0x20);
    CVar10 = remapCubeEdgeCoords((CubeFaceIntCoords *)&local_d8,iVar5);
    CVar3 = CVar10.face;
    hasBothCoordsOutOfBounds[lVar8] = CVar3 == CUBEFACE_LAST;
    if (CVar3 != CUBEFACE_LAST) {
      lookup(&local_d8,CVar3 * 0x28 + (int)local_a0,CVar10.s,CVar10.t);
      *(ulong *)pVVar7->m_data = CONCAT44(local_d8.m_format.type,local_d8.m_format.order);
      *(ulong *)(pVVar7->m_data + 2) = CONCAT44(local_d8.m_size.m_data[1],local_d8.m_size.m_data[0])
      ;
    }
    pVVar7 = pVVar7 + 1;
  }
  uVar6 = 0xffffffffffffffff;
  for (uVar4 = 0; uVar4 != 4; uVar4 = uVar4 + 1) {
    if (hasBothCoordsOutOfBounds[uVar4] != false) {
      uVar6 = uVar4;
    }
    uVar6 = uVar6 & 0xffffffff;
  }
  iVar5 = (int)uVar6;
  if (iVar5 != -1) {
    Vector<float,_4>::Vector((Vector<float,_4> *)&local_d8,0.0);
    a = sampleColors + iVar5;
    *(ulong *)a->m_data = CONCAT44(local_d8.m_format.type,local_d8.m_format.order);
    *(ulong *)(sampleColors[iVar5].m_data + 2) =
         CONCAT44(local_d8.m_size.m_data[1],local_d8.m_size.m_data[0]);
    for (lVar8 = 0; lVar8 != 0x40; lVar8 = lVar8 + 0x10) {
      if ((uVar6 & 0xffffffff) << 4 != lVar8) {
        Vector<float,_4>::operator+=(a,(Vector<float,_4> *)((long)sampleColors[0].m_data + lVar8));
      }
    }
    operator*((tcu *)&local_d8,0.33333334,a);
    *(ulong *)a->m_data = CONCAT44(local_d8.m_format.type,local_d8.m_format.order);
    *(ulong *)(sampleColors[iVar5].m_data + 2) =
         CONCAT44(local_d8.m_size.m_data[1],local_d8.m_size.m_data[0]);
  }
  for (lVar8 = 0; lVar8 != 0x40; lVar8 = lVar8 + 0x10) {
    uVar2 = *(undefined8 *)((long)sampleColors[0].m_data + lVar8 + 8);
    puVar1 = (undefined8 *)(CONCAT44(in_register_00000014,depth) + lVar8);
    *puVar1 = *(undefined8 *)((long)sampleColors[0].m_data + lVar8);
    puVar1[1] = uVar2;
  }
  return;
}

Assistant:

static void getCubeLinearSamples (const ConstPixelBufferAccess (&faceAccesses)[CUBEFACE_LAST], CubeFace baseFace, float u, float v, int depth, Vec4 (&dst)[4])
{
	DE_ASSERT(faceAccesses[0].getWidth() == faceAccesses[0].getHeight());
	int		size					= faceAccesses[0].getWidth();
	int		x0						= deFloorFloatToInt32(u-0.5f);
	int		x1						= x0+1;
	int		y0						= deFloorFloatToInt32(v-0.5f);
	int		y1						= y0+1;
	IVec2	baseSampleCoords[4]		=
	{
		IVec2(x0, y0),
		IVec2(x1, y0),
		IVec2(x0, y1),
		IVec2(x1, y1)
	};
	Vec4	sampleColors[4];
	bool	hasBothCoordsOutOfBounds[4]; //!< Whether correctCubeFace() returns CUBEFACE_LAST, i.e. both u and v are out of bounds.

	// Find correct faces and coordinates for out-of-bounds sample coordinates.

	for (int i = 0; i < 4; i++)
	{
		CubeFaceIntCoords coords = remapCubeEdgeCoords(CubeFaceIntCoords(baseFace, baseSampleCoords[i]), size);
		hasBothCoordsOutOfBounds[i] = coords.face == CUBEFACE_LAST;
		if (!hasBothCoordsOutOfBounds[i])
			sampleColors[i] = lookup(faceAccesses[coords.face], coords.s, coords.t, depth);
	}

	// If a sample was out of bounds in both u and v, we get its color from the average of the three other samples.
	// \note This averaging behavior is not required by the GLES3 spec (though it is recommended). GLES3 spec only
	//		 requires that if the three other samples all have the same color, then the doubly-out-of-bounds sample
	//		 must have this color as well.

	{
		int bothOutOfBoundsNdx = -1;
		for (int i = 0; i < 4; i++)
		{
			if (hasBothCoordsOutOfBounds[i])
			{
				DE_ASSERT(bothOutOfBoundsNdx < 0); // Only one sample can be out of bounds in both u and v.
				bothOutOfBoundsNdx = i;
			}
		}
		if (bothOutOfBoundsNdx != -1)
		{
			sampleColors[bothOutOfBoundsNdx] = Vec4(0.0f);
			for (int i = 0; i < 4; i++)
				if (i != bothOutOfBoundsNdx)
					sampleColors[bothOutOfBoundsNdx] += sampleColors[i];

			sampleColors[bothOutOfBoundsNdx] = sampleColors[bothOutOfBoundsNdx] * (1.0f/3.0f);
		}
	}

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(sampleColors); i++)
		dst[i] = sampleColors[i];
}